

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

void pull_bytes(void *dst,size_t len,uchar **cursor,size_t *max)

{
  size_t sVar1;
  
  if (*max < len) {
    memcpy(dst,*cursor,*max);
    sVar1 = 0;
    memset((void *)((long)dst + *max),0,len - *max);
    *cursor = (uchar *)0x0;
  }
  else {
    memcpy(dst,*cursor,len);
    *cursor = *cursor + len;
    sVar1 = *max - len;
  }
  *max = sVar1;
  return;
}

Assistant:

void pull_bytes(void *dst, size_t len,
                const unsigned char **cursor, size_t *max)
{
    if (len > *max) {
        memcpy(dst, *cursor, *max);
        memset((char *)dst + *max, 0, len - *max);
        pull_failed(cursor, max);
        return;
    }
    memcpy(dst, *cursor, len);
    *cursor += len;
    *max -= len;
}